

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

JointBeliefInterface * __thiscall
PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(PlanningUnitMADPDiscrete *this)

{
  int iVar1;
  undefined4 extraout_var;
  MultiAgentDecisionProcessDiscreteInterface *pMVar3;
  undefined8 uVar4;
  PlanningUnitMADPDiscrete *in_RDI;
  StateDistribution *isd;
  MultiAgentDecisionProcessDiscreteInterface *madpd;
  JointBeliefInterface *b0;
  JointBeliefInterface *pJVar2;
  
  iVar1 = (*(in_RDI->super_PlanningUnit)._vptr_PlanningUnit[10])();
  pJVar2 = (JointBeliefInterface *)CONCAT44(extraout_var,iVar1);
  pMVar3 = GetMADPDI(in_RDI);
  uVar4 = (**(code **)((long)*pMVar3 + 0x50))();
  (**(code **)(*(long *)((long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8)) + 0x28))
            ((long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8),uVar4);
  return pJVar2;
}

Assistant:

JointBeliefInterface* PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD() const
{
    JointBeliefInterface* b0 = GetNewJointBeliefInterface();
    const MultiAgentDecisionProcessDiscreteInterface* madpd = GetMADPDI();
    const StateDistribution* isd = madpd->GetISD();
    b0->Set( *isd );
    return(b0);
}